

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O3

int GetLatestDataNMEADevice(NMEADEVICE *pNMEADevice,NMEADATA *pNMEAData)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  NMEADATA *pNVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  NMEADATA *pNVar23;
  long lVar24;
  char *pcVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  char c2;
  char c1;
  NMEADATA *local_19c0;
  char *local_19b8;
  char c0;
  char *local_19a8;
  int *local_19a0;
  char *local_1998;
  double *local_1990;
  char *local_1988;
  double *local_1980;
  char *local_1978;
  char *local_1970;
  double *local_1968;
  char *local_1960;
  char *local_1958;
  char *local_1950;
  char *local_1948;
  char *local_1940;
  char *local_1938;
  double *local_1930;
  double *local_1928;
  double *local_1920;
  double f2;
  double f1;
  CHRONO chrono;
  double f0;
  char aisbuf [128];
  char recvbuf [4096];
  char savebuf [2048];
  
  c0 = '\0';
  c1 = '\0';
  c2 = '\0';
  f0 = 0.0;
  f1 = 0.0;
  f2 = 0.0;
  iVar12 = clock_getres(4,(timespec *)&chrono.Frequency);
  if ((iVar12 == 0) && (iVar12 = clock_gettime(4,(timespec *)&chrono), iVar12 == 0)) {
    chrono.Suspended = 0;
    chrono.Finish.tv_sec = 0;
    chrono.Finish.tv_nsec = 0;
    chrono.Duration.tv_sec = 0;
    chrono.Duration.tv_nsec = 0;
  }
  memset(recvbuf,0,0x1000);
  memset(savebuf,0,0x800);
  iVar12 = (pNMEADevice->RS232Port).DevType;
  if (iVar12 - 1U < 4) {
    pcVar14 = (char *)recv((pNMEADevice->RS232Port).s,recvbuf,0x7ff,0);
  }
  else {
    if (iVar12 != 0) goto LAB_00164582;
    pcVar14 = (char *)read(*(int *)&(pNMEADevice->RS232Port).hDev,recvbuf,0x7ff);
  }
  uVar13 = (uint)pcVar14;
  if ((int)uVar13 < 1) {
LAB_00164582:
    pcVar14 = "Error reading data from a NMEADevice. ";
LAB_00164589:
    puts(pcVar14);
    return 1;
  }
  if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
    fwrite(recvbuf,(ulong)pcVar14 & 0xffffffff,1,(FILE *)pNMEADevice->pfSaveFile);
    fflush((FILE *)pNMEADevice->pfSaveFile);
  }
  if (0x7fe < uVar13) {
    if (uVar13 == 0x7ff) {
      do {
        lVar24 = chrono.Duration.tv_sec;
        lVar21 = chrono.Duration.tv_nsec;
        if (chrono.Suspended == 0) {
          clock_gettime(4,(timespec *)aisbuf);
          lVar24 = ((aisbuf._0_8_ + chrono.Duration.tv_sec) - chrono.Start.tv_sec) +
                   (aisbuf._8_8_ + chrono.Duration.tv_nsec) / 1000000000;
          lVar21 = (aisbuf._8_8_ + chrono.Duration.tv_nsec) % 1000000000 - chrono.Start.tv_nsec;
          if (lVar21 < 0) {
            lVar24 = lVar24 + ~((ulong)-lVar21 / 1000000000);
            lVar21 = lVar21 + 1000000000 + ((ulong)-lVar21 / 1000000000) * 1000000000;
          }
        }
        if (4.0 < (double)lVar21 / 1000000000.0 + (double)lVar24) goto LAB_00164595;
        memcpy(savebuf,recvbuf,0x7ff);
        iVar12 = (pNMEADevice->RS232Port).DevType;
        if (iVar12 - 1U < 4) {
          pcVar14 = (char *)recv((pNMEADevice->RS232Port).s,recvbuf,0x7ff,0);
        }
        else {
          if (iVar12 != 0) goto LAB_00164582;
          pcVar14 = (char *)read(*(int *)&(pNMEADevice->RS232Port).hDev,recvbuf,0x7ff);
        }
        if ((int)pcVar14 < 1) goto LAB_00164582;
        if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,(ulong)pcVar14 & 0xffffffff,1,(FILE *)pNMEADevice->pfSaveFile);
          fflush((FILE *)pNMEADevice->pfSaveFile);
        }
      } while ((int)pcVar14 == 0x7ff);
    }
    uVar20 = (ulong)pcVar14 & 0xffffffff;
    memmove(recvbuf + (0x7ff - uVar20),recvbuf,uVar20);
    memcpy(recvbuf,savebuf + uVar20,(long)(0x7ff - (int)pcVar14));
    pcVar14 = (char *)0x7ff;
  }
  local_19a8 = (char *)CONCAT44(local_19a8._4_4_,pNMEADevice->bEnableGPGGA);
  local_19c0 = pNMEAData;
  local_19b8 = pcVar14;
  if (pNMEADevice->bEnableGPGGA == 0) {
LAB_0016394f:
    pcVar15 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$GPGGA");
    if (pcVar14 == (char *)0x0) goto LAB_0016394f;
    pcVar15 = strchr(pcVar14 + 6,0xd);
    if (pcVar15 == (char *)0x0) goto LAB_0016394f;
    do {
      pcVar15 = pcVar14;
      pcVar14 = strstr(pcVar15 + 6,"$GPGGA");
      if (pcVar14 == (char *)0x0) break;
      pcVar16 = strchr(pcVar14 + 6,0xd);
    } while (pcVar16 != (char *)0x0);
  }
  local_19a0 = (int *)CONCAT44(local_19a0._4_4_,pNMEADevice->bEnableGPRMC);
  if (pNMEADevice->bEnableGPRMC == 0) {
LAB_001639cc:
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$GPRMC");
    if (pcVar14 == (char *)0x0) goto LAB_001639cc;
    pcVar16 = strchr(pcVar14 + 6,0xd);
    if (pcVar16 == (char *)0x0) goto LAB_001639cc;
    do {
      pcVar16 = pcVar14;
      pcVar14 = strstr(pcVar16 + 6,"$GPRMC");
      if (pcVar14 == (char *)0x0) break;
      pcVar17 = strchr(pcVar14 + 6,0xd);
    } while (pcVar17 != (char *)0x0);
  }
  local_1970 = (char *)CONCAT44(local_1970._4_4_,pNMEADevice->bEnableGPGLL);
  if (pNMEADevice->bEnableGPGLL == 0) {
LAB_00163a4a:
    pcVar17 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$GPGLL");
    if (pcVar14 == (char *)0x0) goto LAB_00163a4a;
    pcVar17 = strchr(pcVar14 + 6,0xd);
    if (pcVar17 == (char *)0x0) goto LAB_00163a4a;
    do {
      pcVar17 = pcVar14;
      pcVar14 = strstr(pcVar17 + 6,"$GPGLL");
      if (pcVar14 == (char *)0x0) break;
      pcVar18 = strchr(pcVar14 + 6,0xd);
    } while (pcVar18 != (char *)0x0);
  }
  local_1978 = (char *)CONCAT44(local_1978._4_4_,pNMEADevice->bEnableGPVTG);
  if (pNMEADevice->bEnableGPVTG == 0) {
LAB_00163acd:
    local_1938 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$GPVTG");
    if (pcVar14 == (char *)0x0) goto LAB_00163acd;
    pcVar18 = strchr(pcVar14 + 6,0xd);
    if (pcVar18 == (char *)0x0) goto LAB_00163acd;
    do {
      local_1938 = pcVar14;
      pcVar14 = strstr(pcVar14 + 6,"$GPVTG");
      if (pcVar14 == (char *)0x0) break;
      pcVar18 = strchr(pcVar14 + 6,0xd);
    } while (pcVar18 != (char *)0x0);
  }
  local_1980 = (double *)CONCAT44(local_1980._4_4_,pNMEADevice->bEnableHCHDG);
  if (pNMEADevice->bEnableHCHDG == 0) {
LAB_00163b59:
    local_1940 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$HCHDG");
    if (pcVar14 == (char *)0x0) goto LAB_00163b59;
    pcVar18 = strchr(pcVar14 + 6,0xd);
    if (pcVar18 == (char *)0x0) goto LAB_00163b59;
    do {
      local_1940 = pcVar14;
      pcVar14 = strstr(pcVar14 + 6,"$HCHDG");
      if (pcVar14 == (char *)0x0) break;
      pcVar18 = strchr(pcVar14 + 6,0xd);
    } while (pcVar18 != (char *)0x0);
  }
  local_1988 = (char *)CONCAT44(local_1988._4_4_,pNMEADevice->bEnableIIMWV);
  if (pNMEADevice->bEnableIIMWV == 0) {
LAB_00163be5:
    local_1948 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$IIMWV");
    if (pcVar14 == (char *)0x0) goto LAB_00163be5;
    pcVar18 = strchr(pcVar14 + 6,0xd);
    if (pcVar18 == (char *)0x0) goto LAB_00163be5;
    do {
      local_1948 = pcVar14;
      pcVar14 = strstr(pcVar14 + 6,"$IIMWV");
      if (pcVar14 == (char *)0x0) break;
      pcVar18 = strchr(pcVar14 + 6,0xd);
    } while (pcVar18 != (char *)0x0);
  }
  local_1930 = (double *)CONCAT44(local_1930._4_4_,pNMEADevice->bEnableWIMWV);
  if (pNMEADevice->bEnableWIMWV == 0) {
LAB_00163c74:
    local_1950 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$WIMWV");
    if (pcVar14 == (char *)0x0) goto LAB_00163c74;
    pcVar18 = strchr(pcVar14 + 6,0xd);
    if (pcVar18 == (char *)0x0) goto LAB_00163c74;
    do {
      local_1950 = pcVar14;
      pcVar14 = strstr(pcVar14 + 6,"$WIMWV");
      if (pcVar14 == (char *)0x0) break;
      pcVar18 = strchr(pcVar14 + 6,0xd);
    } while (pcVar18 != (char *)0x0);
  }
  local_1990 = (double *)CONCAT44(local_1990._4_4_,pNMEADevice->bEnableWIMWD);
  if (pNMEADevice->bEnableWIMWD == 0) {
LAB_00163d00:
    local_1958 = (char *)0x0;
  }
  else {
    pcVar14 = strstr(recvbuf,"$WIMWD");
    if (pcVar14 == (char *)0x0) goto LAB_00163d00;
    pcVar18 = strchr(pcVar14 + 6,0xd);
    if (pcVar18 == (char *)0x0) goto LAB_00163d00;
    do {
      local_1958 = pcVar14;
      pcVar14 = strstr(pcVar14 + 6,"$WIMWD");
      if (pcVar14 == (char *)0x0) break;
      pcVar18 = strchr(pcVar14 + 6,0xd);
    } while (pcVar18 != (char *)0x0);
  }
  local_1998 = (char *)CONCAT44(local_1998._4_4_,pNMEADevice->bEnableWIMDA);
  if (pNMEADevice->bEnableWIMDA != 0) {
    pcVar14 = strstr(recvbuf,"$WIMDA");
    if (pcVar14 != (char *)0x0) {
      pcVar18 = strchr(pcVar14 + 6,0xd);
      if (pcVar18 != (char *)0x0) {
        do {
          local_1960 = pcVar14;
          pcVar14 = strstr(pcVar14 + 6,"$WIMDA");
          if (pcVar14 == (char *)0x0) break;
          pcVar18 = strchr(pcVar14 + 6,0xd);
        } while (pcVar18 != (char *)0x0);
        goto LAB_00163d92;
      }
    }
  }
  local_1960 = (char *)0x0;
LAB_00163d92:
  local_1968 = (double *)CONCAT44(local_1968._4_4_,pNMEADevice->bEnableAIVDM);
  if (((pNMEADevice->bEnableAIVDM == 0) ||
      (pcVar14 = strstr(recvbuf,"!AIVDM"), pcVar14 == (char *)0x0)) ||
     (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
    pcVar25 = (char *)0x0;
    pcVar18 = local_19b8;
  }
  else {
    do {
      pcVar25 = pcVar14;
      pcVar14 = strstr(pcVar25 + 6,"!AIVDM");
      pcVar18 = local_19b8;
      if (pcVar14 == (char *)0x0) break;
      pcVar19 = strchr(pcVar14 + 6,0xd);
      pcVar18 = local_19b8;
    } while (pcVar19 != (char *)0x0);
  }
LAB_00163e15:
  if (((((((((int)local_19a8 == 0) || (pcVar15 != (char *)0x0)) &&
          (((int)local_19a0 == 0 || (pcVar16 != (char *)0x0)))) &&
         (((int)local_1970 == 0 || (pcVar17 != (char *)0x0)))) &&
        (((int)local_1978 == 0 || (local_1938 != (char *)0x0)))) &&
       (((((int)local_1980 == 0 || (local_1940 != (char *)0x0)) &&
         (((int)local_1988 == 0 || (local_1948 != (char *)0x0)))) &&
        (((int)local_1930 == 0 || (local_1950 != (char *)0x0)))))) &&
      (((int)local_1990 == 0 || (local_1958 != (char *)0x0)))) &&
     ((((int)local_1998 == 0 || (local_1960 != (char *)0x0)) &&
      (((int)local_1968 == 0 || (pcVar25 != (char *)0x0)))))) {
    memset(local_19c0,0,0x3d8);
    pNVar23 = local_19c0;
    if (pNMEADevice->bEnableGPGGA != 0) {
      local_19a8 = local_19c0->szlatdeg;
      local_19b8 = local_19c0->szlongdeg;
      local_1998 = local_19c0->szlatdeg + 1;
      local_1968 = &local_19c0->latmin;
      pcVar14 = &local_19c0->north;
      local_1970 = local_19c0->szlongdeg + 1;
      local_1978 = local_19c0->szlongdeg + 2;
      local_1980 = &local_19c0->longmin;
      local_1988 = &local_19c0->east;
      local_19a0 = &local_19c0->GPS_quality_indicator;
      local_1990 = (double *)&local_19c0->nbsat;
      local_1920 = &local_19c0->hdop;
      local_1928 = &local_19c0->Altitude;
      local_19c0->szlongdeg[0] = '\0';
      local_19c0->szlongdeg[1] = '\0';
      local_19c0->szlongdeg[2] = '\0';
      local_19c0->szlongdeg[3] = '\0';
      local_19c0->szlatdeg[0] = '\0';
      local_19c0->szlatdeg[1] = '\0';
      local_19c0->szlatdeg[2] = '\0';
      local_19c0->szlongdeg[0] = '\0';
      local_1930 = (double *)pcVar14;
      iVar12 = __isoc99_sscanf(pcVar15,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M",
                               local_19c0);
      if ((((iVar12 == 0xf) ||
           (iVar12 = __isoc99_sscanf(pcVar15,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M",
                                     pNVar23,local_19a8,local_1998,local_1968,pcVar14,local_19b8,
                                     local_1970,local_1978,local_1980,local_1988,local_19a0,
                                     local_1990,local_1920,local_1928), iVar12 == 0xe)) ||
          (iVar12 = __isoc99_sscanf(pcVar15,"$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d",pNVar23,
                                    local_19a8,local_1998,local_1968,pcVar14,local_19b8,local_1970,
                                    local_1978,local_1980,local_1988,local_19a0), iVar12 == 0xb)) ||
         ((iVar12 = __isoc99_sscanf(pcVar15,"$GPGGA,%lf,,,,,%d",pNVar23,local_19a0), iVar12 == 2 ||
          (iVar12 = __isoc99_sscanf(pcVar15,"$GPGGA,,,,,,%d",local_19a0), iVar12 == 1)))) {
        dVar34 = pNVar23->utc;
        if (0.0 < dVar34) {
          iVar12 = (int)dVar34 / 10000;
          pNVar23->hour = iVar12;
          iVar22 = iVar12 * -100 + (int)dVar34 / 100;
          pNVar23->minute = iVar22;
          pNVar23->second = (dVar34 - (double)(iVar12 * 10000)) - (double)(iVar22 * 100);
        }
        if ((*local_19a8 != '\0') && (*local_19b8 != '\0')) {
          iVar12 = atoi(local_19a8);
          pNVar23 = local_19c0;
          local_19c0->latdeg = iVar12;
          iVar22 = atoi(local_19b8);
          pNVar23->longdeg = iVar22;
          uVar5 = pNVar23->north;
          uVar8 = pNVar23->east;
          auVar26[0] = -(uVar5 == 'N');
          auVar26[1] = -(uVar5 == 'N');
          auVar26[2] = -(uVar8 == 'E');
          auVar26[3] = -(uVar8 == 'E');
          auVar26[4] = 0xff;
          auVar26[5] = 0xff;
          auVar26[6] = 0xff;
          auVar26[7] = 0xff;
          auVar26[8] = 0xff;
          auVar26[9] = 0xff;
          auVar26[10] = 0xff;
          auVar26[0xb] = 0xff;
          auVar26[0xc] = 0xff;
          auVar26[0xd] = 0xff;
          auVar26[0xe] = 0xff;
          auVar26[0xf] = 0xff;
          auVar26 = pshuflw(auVar26,auVar26,0x50);
          auVar35._0_8_ = pNVar23->latmin;
          auVar35._8_8_ = pNVar23->longmin;
          auVar35 = divpd(auVar35,_DAT_001cc580);
          auVar27._0_8_ = CONCAT44(auVar26._0_4_,auVar26._0_4_);
          auVar27._8_4_ = auVar26._4_4_;
          auVar27._12_4_ = auVar26._4_4_;
          dVar34 = auVar35._0_8_ + (double)iVar12;
          dVar36 = auVar35._8_8_ + (double)iVar22;
          pNVar23->Latitude =
               (double)(~auVar27._0_8_ & (ulong)-dVar34 | (ulong)dVar34 & auVar27._0_8_);
          pNVar23->Longitude =
               (double)(~auVar27._8_8_ & (ulong)-dVar36 | (ulong)dVar36 & auVar27._8_8_);
        }
        goto LAB_00164923;
      }
LAB_001651bf:
      pcVar14 = "Error reading data from a NMEADevice : Invalid data. ";
      goto LAB_00164589;
    }
LAB_00164923:
    pNVar23 = local_19c0;
    if (pNMEADevice->bEnableGPRMC != 0) {
      local_19a8 = local_19c0->szlatdeg;
      local_19b8 = local_19c0->szlongdeg;
      local_1998 = &local_19c0->status;
      local_1968 = (double *)(local_19c0->szlatdeg + 1);
      pdVar1 = &local_19c0->latmin;
      local_19a0 = (int *)&local_19c0->north;
      local_1970 = local_19c0->szlongdeg + 1;
      local_1978 = local_19c0->szlongdeg + 2;
      local_1980 = &local_19c0->longmin;
      local_1988 = &local_19c0->east;
      local_1990 = &local_19c0->sog;
      local_1920 = &local_19c0->cog;
      local_1928 = &local_19c0->date;
      pNVar23->szlongdeg[0] = '\0';
      pNVar23->szlongdeg[1] = '\0';
      pNVar23->szlongdeg[2] = '\0';
      pNVar23->szlongdeg[3] = '\0';
      pNVar23->szlatdeg[0] = '\0';
      pNVar23->szlatdeg[1] = '\0';
      pNVar23->szlatdeg[2] = '\0';
      pNVar23->szlongdeg[0] = '\0';
      local_1930 = pdVar1;
      iVar12 = __isoc99_sscanf(pcVar16,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c",
                               local_19c0);
      if ((((iVar12 != 0x10) &&
           (iVar12 = __isoc99_sscanf(pcVar16,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf",
                                     pNVar23,local_1998,local_19a8,local_1968,pdVar1,local_19a0,
                                     local_19b8,local_1970,local_1978,local_1980,local_1988,
                                     local_1990,local_1920,local_1928), iVar12 != 0xe)) &&
          (iVar12 = __isoc99_sscanf(pcVar16,"$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c",pNVar23,
                                    local_1998,local_19a8,local_1968,pdVar1,local_19a0,local_19b8,
                                    local_1970,local_1978,local_1980,local_1988), iVar12 != 0xb)) &&
         ((iVar12 = __isoc99_sscanf(pcVar16,"$GPRMC,%lf,%c",pNVar23,local_1998), iVar12 != 2 &&
          (iVar12 = __isoc99_sscanf(pcVar16,"$GPRMC,,%c",local_1998), iVar12 != 1))))
      goto LAB_001651bf;
      dVar34 = pNVar23->utc;
      if (0.0 < dVar34) {
        iVar12 = (int)dVar34 / 10000;
        pNVar23->hour = iVar12;
        iVar22 = iVar12 * -100 + (int)dVar34 / 100;
        pNVar23->minute = iVar22;
        pNVar23->second = (dVar34 - (double)(iVar12 * 10000)) - (double)(iVar22 * 100);
      }
      if ((*local_19a8 != '\0') && (*local_19b8 != '\0')) {
        iVar12 = atoi(local_19a8);
        pNVar23->latdeg = iVar12;
        iVar22 = atoi(local_19b8);
        pNVar23->longdeg = iVar22;
        uVar6 = pNVar23->north;
        uVar9 = pNVar23->east;
        auVar28[0] = -(uVar6 == 'N');
        auVar28[1] = -(uVar6 == 'N');
        auVar28[2] = -(uVar9 == 'E');
        auVar28[3] = -(uVar9 == 'E');
        auVar28[4] = 0xff;
        auVar28[5] = 0xff;
        auVar28[6] = 0xff;
        auVar28[7] = 0xff;
        auVar28[8] = 0xff;
        auVar28[9] = 0xff;
        auVar28[10] = 0xff;
        auVar28[0xb] = 0xff;
        auVar28[0xc] = 0xff;
        auVar28[0xd] = 0xff;
        auVar28[0xe] = 0xff;
        auVar28[0xf] = 0xff;
        auVar35 = pshuflw(auVar28,auVar28,0x50);
        auVar3._0_8_ = pNVar23->latmin;
        auVar3._8_8_ = pNVar23->longmin;
        auVar26 = divpd(auVar3,_DAT_001cc580);
        auVar29._0_8_ = CONCAT44(auVar35._0_4_,auVar35._0_4_);
        auVar29._8_4_ = auVar35._4_4_;
        auVar29._12_4_ = auVar35._4_4_;
        dVar34 = auVar26._0_8_ + (double)iVar12;
        dVar36 = auVar26._8_8_ + (double)iVar22;
        pNVar23->Latitude =
             (double)(~auVar29._0_8_ & (ulong)-dVar34 | (ulong)dVar34 & auVar29._0_8_);
        pNVar23->Longitude =
             (double)(~auVar29._8_8_ & (ulong)-dVar36 | (ulong)dVar36 & auVar29._8_8_);
      }
      auVar32._8_8_ = pNVar23->cog * 3.141592653589793;
      auVar32._0_8_ = pNVar23->sog;
      auVar35 = divpd(auVar32,_DAT_001cc590);
      pNVar23->SOG = (double)auVar35._0_8_;
      pNVar23->COG = (double)auVar35._8_8_;
      if (0.0 < pNVar23->date) {
        iVar12 = (int)pNVar23->date;
        pNVar23->day = iVar12 / 10000;
        iVar22 = (iVar12 / 10000) * -100 + iVar12 / 100;
        pNVar23->month = iVar22;
        pNVar23->year = iVar12 % 10000 + iVar22 * -100 + 2000;
      }
    }
    pNVar11 = local_19c0;
    if (pNMEADevice->bEnableGPGLL != 0) {
      local_19a8 = pNVar23->szlatdeg;
      pcVar14 = pNVar23->szlongdeg;
      local_19b8 = pNVar23->szlongdeg + 1;
      pcVar15 = &local_19c0->status;
      local_19c0->szlongdeg[0] = '\0';
      local_19c0->szlongdeg[1] = '\0';
      local_19c0->szlongdeg[2] = '\0';
      local_19c0->szlongdeg[3] = '\0';
      local_19c0->szlatdeg[0] = '\0';
      local_19c0->szlatdeg[1] = '\0';
      local_19c0->szlatdeg[2] = '\0';
      local_19c0->szlongdeg[0] = '\0';
      iVar12 = __isoc99_sscanf(pcVar17,"$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c",local_19a8,
                               pNVar23->szlatdeg + 1,&pNVar23->latmin,&pNVar23->north,pcVar14,
                               local_19b8,pNVar23->szlongdeg + 2,&local_19c0->longmin,
                               &local_19c0->east,local_19c0,pcVar15);
      if (((iVar12 != 0xb) &&
          (iVar12 = __isoc99_sscanf(pcVar17,"$GPGLL,,,,,%lf,%c",pNVar11,pcVar15), iVar12 != 2)) &&
         (iVar12 = __isoc99_sscanf(pcVar17,"$GPGLL,,,,,,%c",pcVar15), iVar12 != 1))
      goto LAB_001651bf;
      pNVar23 = pNVar11;
      if ((*local_19a8 != '\0') && (*pcVar14 != '\0')) {
        iVar12 = atoi(local_19a8);
        local_19c0->latdeg = iVar12;
        iVar22 = atoi(pcVar14);
        local_19c0->longdeg = iVar22;
        uVar7 = local_19c0->north;
        uVar10 = local_19c0->east;
        auVar30[0] = -(uVar7 == 'N');
        auVar30[1] = -(uVar7 == 'N');
        auVar30[2] = -(uVar10 == 'E');
        auVar30[3] = -(uVar10 == 'E');
        auVar30[4] = 0xff;
        auVar30[5] = 0xff;
        auVar30[6] = 0xff;
        auVar30[7] = 0xff;
        auVar30[8] = 0xff;
        auVar30[9] = 0xff;
        auVar30[10] = 0xff;
        auVar30[0xb] = 0xff;
        auVar30[0xc] = 0xff;
        auVar30[0xd] = 0xff;
        auVar30[0xe] = 0xff;
        auVar30[0xf] = 0xff;
        auVar35 = pshuflw(auVar30,auVar30,0x50);
        auVar4._0_8_ = local_19c0->latmin;
        auVar4._8_8_ = local_19c0->longmin;
        auVar26 = divpd(auVar4,_DAT_001cc580);
        auVar31._0_8_ = CONCAT44(auVar35._0_4_,auVar35._0_4_);
        auVar31._8_4_ = auVar35._4_4_;
        auVar31._12_4_ = auVar35._4_4_;
        dVar34 = auVar26._0_8_ + (double)iVar12;
        dVar36 = auVar26._8_8_ + (double)iVar22;
        local_19c0->Latitude =
             (double)(~auVar31._0_8_ & (ulong)-dVar34 | (ulong)dVar34 & auVar31._0_8_);
        local_19c0->Longitude =
             (double)(~auVar31._8_8_ & (ulong)-dVar36 | (ulong)dVar36 & auVar31._8_8_);
        pNVar23 = local_19c0;
      }
      dVar34 = pNVar23->utc;
      if (0.0 < dVar34) {
        iVar12 = (int)dVar34 / 10000;
        pNVar23->hour = iVar12;
        iVar22 = iVar12 * -100 + (int)dVar34 / 100;
        pNVar23->minute = iVar22;
        pNVar23->second = (dVar34 - (double)(iVar12 * 10000)) - (double)(iVar22 * 100);
      }
    }
    pcVar14 = local_1938;
    if (pNMEADevice->bEnableGPVTG != 0) {
      pdVar1 = &pNVar23->cog;
      pdVar2 = &pNVar23->sog;
      iVar12 = __isoc99_sscanf(local_1938,"$GPVTG,%lf,T,%lf,M,%lf,N",pdVar1,&pNVar23->mag_cog,pdVar2
                              );
      if (((iVar12 != 3) &&
          (iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,%lf,T,,M,%lf,N",pdVar1,pdVar2), iVar12 != 2)) &&
         ((iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,%lf,T,,,%lf,N",pdVar1,pdVar2), iVar12 != 2 &&
          ((((iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,nan,T,nan,M,%lf,N",pdVar2), iVar12 != 1 &&
             (iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,NAN,T,NAN,M,%lf,N",pdVar2), iVar12 != 1)) &&
            (iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,NaN,T,NaN,M,%lf,N",pdVar2), iVar12 != 1)) &&
           ((iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,nan,T,,,%lf,N",pdVar2), iVar12 != 1 &&
            (iVar12 = __isoc99_sscanf(pcVar14,"$GPVTG,NAN,T,,,%lf,N",pdVar2), iVar12 != 1)))))))) {
        __isoc99_sscanf(pcVar14,"$GPVTG,NaN,T,,,%lf,N",pdVar2);
      }
      auVar33._8_8_ = pNVar23->cog * 3.141592653589793;
      auVar33._0_8_ = pNVar23->sog;
      auVar35 = divpd(auVar33,_DAT_001cc590);
      pNVar23->SOG = (double)auVar35._0_8_;
      pNVar23->COG = (double)auVar35._8_8_;
    }
    if (pNMEADevice->bEnableHCHDG != 0) {
      __isoc99_sscanf(local_1940,"$HCHDG,%lf,%lf,%c,%lf,%c",&pNVar23->heading,&pNVar23->deviation,
                      &pNVar23->dev_east,&pNVar23->variation,&pNVar23->var_east);
      pNVar23->Heading = (pNVar23->heading * 3.141592653589793) / 180.0;
    }
    if (pNMEADevice->bEnableIIMWV != 0) {
      pdVar1 = &pNVar23->awindspeed;
      iVar12 = __isoc99_sscanf(local_1948,"$IIMWV,%lf,R,%lf,%c,A",&pNVar23->awinddir,pdVar1,
                               &pNVar23->cawindspeed);
      if (iVar12 != 3) goto LAB_001651bf;
      pNVar23->ApparentWindDir = (pNVar23->awinddir * 3.141592653589793) / 180.0;
      switch(pNVar23->cawindspeed) {
      case 'K':
        dVar34 = *pdVar1 * 0.28;
        break;
      default:
        goto switchD_001650fa_caseD_4c;
      case 'M':
        dVar34 = *pdVar1;
        break;
      case 'N':
        dVar34 = *pdVar1 * 0.51;
        break;
      case 'S':
        dVar34 = *pdVar1 * 0.45;
      }
      local_19c0->ApparentWindSpeed = dVar34;
      pNVar23 = local_19c0;
    }
switchD_001650fa_caseD_4c:
    if (pNMEADevice->bEnableWIMWV != 0) {
      pdVar1 = &pNVar23->awindspeed;
      iVar12 = __isoc99_sscanf(local_1950,"$WIMWV,%lf,R,%lf,%c,A",&pNVar23->awinddir,pdVar1,
                               &pNVar23->cawindspeed);
      if (iVar12 != 3) goto LAB_001651bf;
      pNVar23->ApparentWindDir = (pNVar23->awinddir * 3.141592653589793) / 180.0;
      switch(pNVar23->cawindspeed) {
      case 'K':
        dVar34 = *pdVar1 * 0.28;
        break;
      default:
        goto switchD_001651af_caseD_4c;
      case 'M':
        dVar34 = *pdVar1;
        break;
      case 'N':
        dVar34 = *pdVar1 * 0.51;
        break;
      case 'S':
        dVar34 = *pdVar1 * 0.45;
      }
      local_19c0->ApparentWindSpeed = dVar34;
      pNVar23 = local_19c0;
    }
switchD_001651af_caseD_4c:
    if (pNMEADevice->bEnableWIMWD != 0) {
      __isoc99_sscanf(local_1958,"$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&pNVar23->winddir,
                      &pNVar23->cwinddir,&f1,&c1,&f2,&c2,&pNVar23->windspeed,&pNVar23->cwindspeed);
      pNVar23->WindDir = (pNVar23->winddir * 3.141592653589793) / 180.0;
      pNVar23->WindSpeed = pNVar23->windspeed;
    }
    pNVar11 = local_19c0;
    if (pNMEADevice->bEnableWIMDA != 0) {
      __isoc99_sscanf(local_1960,"$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c",&f0
                      ,&c0,&pNVar23->pressure,&pNVar23->cpressure,&pNVar23->temperature,
                      &pNVar23->ctemperature,&pNVar23->winddir,&pNVar23->cwinddir,&f1,&c1,&f2,&c2,
                      &pNVar23->windspeed,&pNVar23->cwindspeed);
      pNVar11->WindDir = (pNVar11->winddir * 3.141592653589793) / 180.0;
      pNVar11->WindSpeed = pNVar11->windspeed;
      pNVar23 = pNVar11;
    }
    if (pNMEADevice->bEnableAIVDM == 0) goto LAB_0016543f;
    aisbuf[0x70] = '\0';
    aisbuf[0x71] = '\0';
    aisbuf[0x72] = '\0';
    aisbuf[0x73] = '\0';
    aisbuf[0x74] = '\0';
    aisbuf[0x75] = '\0';
    aisbuf[0x76] = '\0';
    aisbuf[0x77] = '\0';
    aisbuf[0x78] = '\0';
    aisbuf[0x79] = '\0';
    aisbuf[0x7a] = '\0';
    aisbuf[0x7b] = '\0';
    aisbuf[0x7c] = '\0';
    aisbuf[0x7d] = '\0';
    aisbuf[0x7e] = '\0';
    aisbuf[0x7f] = '\0';
    aisbuf[0x60] = '\0';
    aisbuf[0x61] = '\0';
    aisbuf[0x62] = '\0';
    aisbuf[99] = '\0';
    aisbuf[100] = '\0';
    aisbuf[0x65] = '\0';
    aisbuf[0x66] = '\0';
    aisbuf[0x67] = '\0';
    aisbuf[0x68] = '\0';
    aisbuf[0x69] = '\0';
    aisbuf[0x6a] = '\0';
    aisbuf[0x6b] = '\0';
    aisbuf[0x6c] = '\0';
    aisbuf[0x6d] = '\0';
    aisbuf[0x6e] = '\0';
    aisbuf[0x6f] = '\0';
    aisbuf[0x50] = '\0';
    aisbuf[0x51] = '\0';
    aisbuf[0x52] = '\0';
    aisbuf[0x53] = '\0';
    aisbuf[0x54] = '\0';
    aisbuf[0x55] = '\0';
    aisbuf[0x56] = '\0';
    aisbuf[0x57] = '\0';
    aisbuf[0x58] = '\0';
    aisbuf[0x59] = '\0';
    aisbuf[0x5a] = '\0';
    aisbuf[0x5b] = '\0';
    aisbuf[0x5c] = '\0';
    aisbuf[0x5d] = '\0';
    aisbuf[0x5e] = '\0';
    aisbuf[0x5f] = '\0';
    aisbuf[0x40] = '\0';
    aisbuf[0x41] = '\0';
    aisbuf[0x42] = '\0';
    aisbuf[0x43] = '\0';
    aisbuf[0x44] = '\0';
    aisbuf[0x45] = '\0';
    aisbuf[0x46] = '\0';
    aisbuf[0x47] = '\0';
    aisbuf[0x48] = '\0';
    aisbuf[0x49] = '\0';
    aisbuf[0x4a] = '\0';
    aisbuf[0x4b] = '\0';
    aisbuf[0x4c] = '\0';
    aisbuf[0x4d] = '\0';
    aisbuf[0x4e] = '\0';
    aisbuf[0x4f] = '\0';
    aisbuf[0x30] = '\0';
    aisbuf[0x31] = '\0';
    aisbuf[0x32] = '\0';
    aisbuf[0x33] = '\0';
    aisbuf[0x34] = '\0';
    aisbuf[0x35] = '\0';
    aisbuf[0x36] = '\0';
    aisbuf[0x37] = '\0';
    aisbuf[0x38] = '\0';
    aisbuf[0x39] = '\0';
    aisbuf[0x3a] = '\0';
    aisbuf[0x3b] = '\0';
    aisbuf[0x3c] = '\0';
    aisbuf[0x3d] = '\0';
    aisbuf[0x3e] = '\0';
    aisbuf[0x3f] = '\0';
    aisbuf[0x20] = '\0';
    aisbuf[0x21] = '\0';
    aisbuf[0x22] = '\0';
    aisbuf[0x23] = '\0';
    aisbuf[0x24] = '\0';
    aisbuf[0x25] = '\0';
    aisbuf[0x26] = '\0';
    aisbuf[0x27] = '\0';
    aisbuf[0x28] = '\0';
    aisbuf[0x29] = '\0';
    aisbuf[0x2a] = '\0';
    aisbuf[0x2b] = '\0';
    aisbuf[0x2c] = '\0';
    aisbuf[0x2d] = '\0';
    aisbuf[0x2e] = '\0';
    aisbuf[0x2f] = '\0';
    aisbuf[0x10] = '\0';
    aisbuf[0x11] = '\0';
    aisbuf[0x12] = '\0';
    aisbuf[0x13] = '\0';
    aisbuf[0x14] = '\0';
    aisbuf[0x15] = '\0';
    aisbuf[0x16] = '\0';
    aisbuf[0x17] = '\0';
    aisbuf[0x18] = '\0';
    aisbuf[0x19] = '\0';
    aisbuf[0x1a] = '\0';
    aisbuf[0x1b] = '\0';
    aisbuf[0x1c] = '\0';
    aisbuf[0x1d] = '\0';
    aisbuf[0x1e] = '\0';
    aisbuf[0x1f] = '\0';
    aisbuf[0] = '\0';
    aisbuf[1] = '\0';
    aisbuf[2] = '\0';
    aisbuf[3] = '\0';
    aisbuf[4] = '\0';
    aisbuf[5] = '\0';
    aisbuf[6] = '\0';
    aisbuf[7] = '\0';
    aisbuf[8] = '\0';
    aisbuf[9] = '\0';
    aisbuf[10] = '\0';
    aisbuf[0xb] = '\0';
    aisbuf[0xc] = '\0';
    aisbuf[0xd] = '\0';
    aisbuf[0xe] = '\0';
    aisbuf[0xf] = '\0';
    __isoc99_sscanf(pcVar25,"!AIVDM,%d,%d,,%c,%127s",&pNVar23->nbsentences,&pNVar23->sentence_number
                    ,&pNVar23->AIS_channel);
    if ((pNVar23->nbsentences != 1) || (pNVar23->sentence_number != 1)) goto LAB_0016543f;
    lVar21 = 0;
    goto LAB_001653c8;
  }
  lVar24 = chrono.Duration.tv_sec;
  lVar21 = chrono.Duration.tv_nsec;
  if (chrono.Suspended == 0) {
    clock_gettime(4,(timespec *)aisbuf);
    lVar24 = ((aisbuf._0_8_ + chrono.Duration.tv_sec) - chrono.Start.tv_sec) +
             (aisbuf._8_8_ + chrono.Duration.tv_nsec) / 1000000000;
    lVar21 = (aisbuf._8_8_ + chrono.Duration.tv_nsec) % 1000000000 - chrono.Start.tv_nsec;
    if (lVar21 < 0) {
      lVar24 = lVar24 + ~((ulong)-lVar21 / 1000000000);
      lVar21 = lVar21 + 1000000000 + ((ulong)-lVar21 / 1000000000) * 1000000000;
    }
  }
  if (4.0 < (double)lVar21 / 1000000000.0 + (double)lVar24) {
LAB_00164595:
    puts("Error reading data from a NMEADevice : Message timeout. ");
    return 2;
  }
  if (0xffe < (uint)pcVar18) {
    puts("Error reading data from a NMEADevice : Invalid data. ");
    return 4;
  }
  pcVar14 = recvbuf + ((ulong)pcVar18 & 0xffffffff);
  uVar13 = 0xfff - (uint)pcVar18;
  iVar12 = (pNMEADevice->RS232Port).DevType;
  local_19b8 = pcVar18;
  if (iVar12 - 1U < 4) {
    uVar20 = recv((pNMEADevice->RS232Port).s,pcVar14,(ulong)uVar13,0);
  }
  else {
    if (iVar12 != 0) goto LAB_00164582;
    uVar20 = read(*(int *)&(pNMEADevice->RS232Port).hDev,pcVar14,(ulong)uVar13);
  }
  if ((int)uVar20 < 1) goto LAB_00164582;
  if ((pNMEADevice->bSaveRawData != 0) && ((FILE *)pNMEADevice->pfSaveFile != (FILE *)0x0)) {
    fwrite(pcVar14,uVar20 & 0xffffffff,1,(FILE *)pNMEADevice->pfSaveFile);
    fflush((FILE *)pNMEADevice->pfSaveFile);
  }
  local_19a8 = (char *)CONCAT44(local_19a8._4_4_,pNMEADevice->bEnableGPGGA);
  if (pNMEADevice->bEnableGPGGA != 0) {
    pcVar14 = strstr(recvbuf,"$GPGGA");
    if ((pcVar14 == (char *)0x0) || (pcVar15 = strchr(pcVar14 + 6,0xd), pcVar15 == (char *)0x0)) {
      pcVar15 = (char *)0x0;
    }
    else {
      do {
        pcVar15 = pcVar14;
        pcVar14 = strstr(pcVar15 + 6,"$GPGGA");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_19a0 = (int *)CONCAT44(local_19a0._4_4_,pNMEADevice->bEnableGPRMC);
  if (pNMEADevice->bEnableGPRMC != 0) {
    pcVar14 = strstr(recvbuf,"$GPRMC");
    if ((pcVar14 == (char *)0x0) || (pcVar16 = strchr(pcVar14 + 6,0xd), pcVar16 == (char *)0x0)) {
      pcVar16 = (char *)0x0;
    }
    else {
      do {
        pcVar16 = pcVar14;
        pcVar14 = strstr(pcVar16 + 6,"$GPRMC");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1970 = (char *)CONCAT44(local_1970._4_4_,pNMEADevice->bEnableGPGLL);
  if (pNMEADevice->bEnableGPGLL != 0) {
    pcVar14 = strstr(recvbuf,"$GPGLL");
    if ((pcVar14 == (char *)0x0) || (pcVar17 = strchr(pcVar14 + 6,0xd), pcVar17 == (char *)0x0)) {
      pcVar17 = (char *)0x0;
    }
    else {
      do {
        pcVar17 = pcVar14;
        pcVar14 = strstr(pcVar17 + 6,"$GPGLL");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1978 = (char *)CONCAT44(local_1978._4_4_,pNMEADevice->bEnableGPVTG);
  if (pNMEADevice->bEnableGPVTG != 0) {
    pcVar14 = strstr(recvbuf,"$GPVTG");
    if ((pcVar14 == (char *)0x0) || (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
      local_1938 = (char *)0x0;
    }
    else {
      do {
        local_1938 = pcVar14;
        pcVar14 = strstr(pcVar14 + 6,"$GPVTG");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1980 = (double *)CONCAT44(local_1980._4_4_,pNMEADevice->bEnableHCHDG);
  if (pNMEADevice->bEnableHCHDG != 0) {
    pcVar14 = strstr(recvbuf,"$HCHDG");
    if ((pcVar14 == (char *)0x0) || (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
      local_1940 = (char *)0x0;
    }
    else {
      do {
        local_1940 = pcVar14;
        pcVar14 = strstr(pcVar14 + 6,"$HCHDG");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1988 = (char *)CONCAT44(local_1988._4_4_,pNMEADevice->bEnableIIMWV);
  if (pNMEADevice->bEnableIIMWV != 0) {
    pcVar14 = strstr(recvbuf,"$IIMWV");
    if ((pcVar14 == (char *)0x0) || (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
      local_1948 = (char *)0x0;
    }
    else {
      do {
        local_1948 = pcVar14;
        pcVar14 = strstr(pcVar14 + 6,"$IIMWV");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1930 = (double *)CONCAT44(local_1930._4_4_,pNMEADevice->bEnableWIMWV);
  if (pNMEADevice->bEnableWIMWV != 0) {
    pcVar14 = strstr(recvbuf,"$WIMWV");
    if ((pcVar14 == (char *)0x0) || (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
      local_1950 = (char *)0x0;
    }
    else {
      do {
        local_1950 = pcVar14;
        pcVar14 = strstr(pcVar14 + 6,"$WIMWV");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1990 = (double *)CONCAT44(local_1990._4_4_,pNMEADevice->bEnableWIMWD);
  if (pNMEADevice->bEnableWIMWD != 0) {
    pcVar14 = strstr(recvbuf,"$WIMWD");
    if ((pcVar14 == (char *)0x0) || (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
      local_1958 = (char *)0x0;
    }
    else {
      do {
        local_1958 = pcVar14;
        pcVar14 = strstr(pcVar14 + 6,"$WIMWD");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  local_1998 = (char *)CONCAT44(local_1998._4_4_,pNMEADevice->bEnableWIMDA);
  if (pNMEADevice->bEnableWIMDA != 0) {
    pcVar14 = strstr(recvbuf,"$WIMDA");
    if ((pcVar14 == (char *)0x0) || (pcVar18 = strchr(pcVar14 + 6,0xd), pcVar18 == (char *)0x0)) {
      local_1960 = (char *)0x0;
    }
    else {
      do {
        local_1960 = pcVar14;
        pcVar14 = strstr(pcVar14 + 6,"$WIMDA");
        if (pcVar14 == (char *)0x0) break;
        pcVar18 = strchr(pcVar14 + 6,0xd);
      } while (pcVar18 != (char *)0x0);
    }
  }
  uVar13 = (int)uVar20 + (int)local_19b8;
  local_1968 = (double *)CONCAT44(local_1968._4_4_,pNMEADevice->bEnableAIVDM);
  pcVar18 = (char *)(ulong)uVar13;
  if (pNMEADevice->bEnableAIVDM != 0) {
    pcVar14 = strstr(recvbuf,"!AIVDM");
    pcVar25 = (char *)0x0;
    pcVar18 = (char *)(ulong)uVar13;
    if (pcVar14 != (char *)0x0) {
      pcVar19 = strchr(pcVar14 + 6,0xd);
      pcVar25 = (char *)0x0;
      pcVar18 = (char *)(ulong)uVar13;
      if (pcVar19 != (char *)0x0) {
        do {
          pcVar25 = pcVar14;
          pcVar14 = strstr(pcVar25 + 6,"!AIVDM");
          if (pcVar14 == (char *)0x0) break;
          pcVar18 = strchr(pcVar14 + 6,0xd);
        } while (pcVar18 != (char *)0x0);
        pcVar18 = (char *)(ulong)uVar13;
      }
    }
  }
  goto LAB_00163e15;
LAB_001653c8:
  if (aisbuf[lVar21] == '\0') {
LAB_0016543f:
    memcpy(&pNMEADevice->LastNMEAData,pNVar23,0x3d8);
    return 0;
  }
  iVar12 = __isoc99_sscanf(aisbuf + lVar21,",%d",&pNVar23->nbfillbits);
  if (iVar12 == 1) {
    memset(aisbuf + lVar21,0,0x80 - lVar21);
    if (lVar21 != 0) {
      decode_AIS(aisbuf,(int)lVar21,&pNVar23->AIS_Latitude,&pNVar23->AIS_Longitude,&pNVar23->AIS_SOG
                 ,&pNVar23->AIS_COG);
    }
    goto LAB_0016543f;
  }
  lVar21 = lVar21 + 1;
  if (lVar21 == 0x7f) goto LAB_0016543f;
  goto LAB_001653c8;
}

Assistant:

inline int GetLatestDataNMEADevice(NMEADEVICE* pNMEADevice, NMEADATA* pNMEAData)
{
	char recvbuf[2*MAX_NB_BYTES_NMEADEVICE];
	char savebuf[MAX_NB_BYTES_NMEADEVICE];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_GPGGA = NULL;
	char* ptr_GPRMC = NULL;
	char* ptr_GPGLL = NULL;
	char* ptr_GPVTG = NULL;
	char* ptr_HCHDG = NULL;
	char* ptr_IIMWV = NULL;
	char* ptr_WIMWV = NULL;
	char* ptr_WIMWD = NULL;
	char* ptr_WIMDA = NULL;
	char* ptr_AIVDM = NULL;
	// Temporary buffers for sscanf().
	char c0 = 0, c1 = 0, c2 = 0;
	double f0 = 0, f1 = 0, f2 = 0;
	char aisbuf[128];
	int aisbuflen = 0;
	int i = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_NMEADEVICE-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a NMEADevice. \n");
		return EXIT_FAILURE;
	}
	if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
		fflush(pNMEADevice->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
			{
				printf("Error reading data from a NMEADevice : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a NMEADevice. \n");
				return EXIT_FAILURE;
			}
			if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pNMEADevice->pfSaveFile);
				fflush(pNMEADevice->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
	if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
	if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
	if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
	if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
	if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
	if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
	if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
	if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);

	while (
		(pNMEADevice->bEnableGPGGA&&!ptr_GPGGA)||
		(pNMEADevice->bEnableGPRMC&&!ptr_GPRMC)||
		(pNMEADevice->bEnableGPGLL&&!ptr_GPGLL)||
		(pNMEADevice->bEnableGPVTG&&!ptr_GPVTG)||
		(pNMEADevice->bEnableHCHDG&&!ptr_HCHDG)||
		(pNMEADevice->bEnableIIMWV&&!ptr_IIMWV)||
		(pNMEADevice->bEnableWIMWV&&!ptr_WIMWV)||
		(pNMEADevice->bEnableWIMWD&&!ptr_WIMWD)||
		(pNMEADevice->bEnableWIMDA&&!ptr_WIMDA)||
		(pNMEADevice->bEnableAIVDM&&!ptr_AIVDM)
		)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_NMEADEVICE)
		{
			printf("Error reading data from a NMEADevice : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_NMEADEVICE-1)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pNMEADevice->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_NMEADEVICE-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a NMEADevice. \n");
			return EXIT_FAILURE;
		}
		if ((pNMEADevice->bSaveRawData)&&(pNMEADevice->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pNMEADevice->pfSaveFile);
			fflush(pNMEADevice->pfSaveFile);
		}
		BytesReceived += Bytes;
		if (pNMEADevice->bEnableGPGGA) ptr_GPGGA = FindLatestNMEASentence("$GPGGA", recvbuf);
		if (pNMEADevice->bEnableGPRMC) ptr_GPRMC = FindLatestNMEASentence("$GPRMC", recvbuf);
		if (pNMEADevice->bEnableGPGLL) ptr_GPGLL = FindLatestNMEASentence("$GPGLL", recvbuf);
		if (pNMEADevice->bEnableGPVTG) ptr_GPVTG = FindLatestNMEASentence("$GPVTG", recvbuf);
		if (pNMEADevice->bEnableHCHDG) ptr_HCHDG = FindLatestNMEASentence("$HCHDG", recvbuf);
		if (pNMEADevice->bEnableIIMWV) ptr_IIMWV = FindLatestNMEASentence("$IIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWV) ptr_WIMWV = FindLatestNMEASentence("$WIMWV", recvbuf);
		if (pNMEADevice->bEnableWIMWD) ptr_WIMWD = FindLatestNMEASentence("$WIMWD", recvbuf);
		if (pNMEADevice->bEnableWIMDA) ptr_WIMDA = FindLatestNMEASentence("$WIMDA", recvbuf);
		if (pNMEADevice->bEnableAIVDM) ptr_AIVDM = FindLatestNMEASentence("!AIVDM", recvbuf);
	}

	// Analyze data.

	memset(pNMEAData, 0, sizeof(NMEADATA));

	// GPS essential fix data.
	if (pNMEADevice->bEnableGPGGA)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude, &pNMEAData->height_geoid) != 15)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d,%d,%lf,%lf,M", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator, &pNMEAData->nbsat, &pNMEAData->hdop, &pNMEAData->Altitude) != 14)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,%c%c%lf,%c,%c%c%c%lf,%c,%d", &pNMEAData->utc, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->GPS_quality_indicator) != 11)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,%lf,,,,,%d", &pNMEAData->utc, &pNMEAData->GPS_quality_indicator) != 2)
			&&
			(sscanf(ptr_GPGGA, "$GPGGA,,,,,,%d", &pNMEAData->GPS_quality_indicator) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}
	}

	// GPS recommended minimum data.
	if (pNMEADevice->bEnableGPRMC)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if (
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf,%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date, &pNMEAData->variation, &pNMEAData->var_east) != 16)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%lf,%lf", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east,
			&pNMEAData->sog, &pNMEAData->cog, &pNMEAData->date) != 14)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c,%c%c%lf,%c,%c%c%c%lf,%c", &pNMEAData->utc, &pNMEAData->status, 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east) != 11)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)
			&&
			(sscanf(ptr_GPRMC, "$GPRMC,,%c", &pNMEAData->status) != 1)
			)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;

		if (pNMEAData->date > 0)
		{
			pNMEAData->day = (int)pNMEAData->date/10000;
			pNMEAData->month = (int)pNMEAData->date/100-pNMEAData->day*100;
			pNMEAData->year = 2000+((int)pNMEAData->date-pNMEAData->day*10000)-pNMEAData->month*100;
		}
	}

	// GPS position, latitude / longitude and time.
	if (pNMEADevice->bEnableGPGLL)
	{
		memset(pNMEAData->szlatdeg, 0, sizeof(pNMEAData->szlatdeg));
		memset(pNMEAData->szlongdeg, 0, sizeof(pNMEAData->szlongdeg));

		if ((sscanf(ptr_GPGLL, "$GPGLL,%c%c%lf,%c,%c%c%c%lf,%c,%lf,%c", 
			&pNMEAData->szlatdeg[0], &pNMEAData->szlatdeg[1], &pNMEAData->latmin, &pNMEAData->north, 
			&pNMEAData->szlongdeg[0], &pNMEAData->szlongdeg[1], &pNMEAData->szlongdeg[2], &pNMEAData->longmin, &pNMEAData->east, 
			&pNMEAData->utc, &pNMEAData->status) != 11)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,%lf,%c", &pNMEAData->utc, &pNMEAData->status) != 2)&&
			(sscanf(ptr_GPGLL, "$GPGLL,,,,,,%c", &pNMEAData->status) != 1))
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		if ((strlen(pNMEAData->szlatdeg) > 0)&&(strlen(pNMEAData->szlongdeg) > 0))
		{
			pNMEAData->latdeg = atoi(pNMEAData->szlatdeg);
			pNMEAData->longdeg = atoi(pNMEAData->szlongdeg);

			// Convert GPS latitude and longitude in decimal.
			pNMEAData->Latitude = (pNMEAData->north == 'N')?(pNMEAData->latdeg+pNMEAData->latmin/60.0):-(pNMEAData->latdeg+pNMEAData->latmin/60.0);
			pNMEAData->Longitude = (pNMEAData->east == 'E')?(pNMEAData->longdeg+pNMEAData->longmin/60.0):-(pNMEAData->longdeg+pNMEAData->longmin/60.0);
		}

		if (pNMEAData->utc > 0)
		{
			pNMEAData->hour = (int)pNMEAData->utc/10000;
			pNMEAData->minute = (int)pNMEAData->utc/100-pNMEAData->hour*100;
			pNMEAData->second = (pNMEAData->utc-pNMEAData->hour*10000)-pNMEAData->minute*100;
		}
	}

	// GPS COG and SOG.
	if (pNMEADevice->bEnableGPVTG)
	{
		if ((sscanf(ptr_GPVTG, "$GPVTG,%lf,T,%lf,M,%lf,N", &pNMEAData->cog, &pNMEAData->mag_cog, &pNMEAData->sog) != 3)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,M,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,%lf,T,,,%lf,N", &pNMEAData->cog, &pNMEAData->sog) != 2)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,nan,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,NAN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,NaN,M,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,nan,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NAN,T,,,%lf,N", &pNMEAData->sog) != 1)&&
			(sscanf(ptr_GPVTG, "$GPVTG,NaN,T,,,%lf,N", &pNMEAData->sog) != 1))
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}

		// Convert SOG to speed in m/s and COG to angle in rad.
		pNMEAData->SOG = pNMEAData->sog/1.94;
		pNMEAData->COG = pNMEAData->cog*M_PI/180.0;
	}

	// Heading data.
	if (pNMEADevice->bEnableHCHDG)
	{
		if (sscanf(ptr_HCHDG, "$HCHDG,%lf,%lf,%c,%lf,%c", 
			&pNMEAData->heading, &pNMEAData->deviation, &pNMEAData->dev_east, &pNMEAData->variation, &pNMEAData->var_east) != 5)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert heading to angle in rad.
		pNMEAData->Heading = pNMEAData->heading*M_PI/180.0;
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableIIMWV)
	{
		if (sscanf(ptr_IIMWV, "$IIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind speed and angle, in relation to the vessel's bow/centerline.
	if (pNMEADevice->bEnableWIMWV)
	{
		if (sscanf(ptr_WIMWV, "$WIMWV,%lf,R,%lf,%c,A", 
			&pNMEAData->awinddir, &pNMEAData->awindspeed, &pNMEAData->cawindspeed) != 3)
		{
			printf("Error reading data from a NMEADevice : Invalid data. \n");
			return EXIT_FAILURE;
		}

		// Convert apparent wind direction to angle in rad.
		pNMEAData->ApparentWindDir = pNMEAData->awinddir*M_PI/180.0;

		// Convert apparent wind speed to m/s.
		switch (pNMEAData->cawindspeed)
		{
		case 'K': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.28; break;
		case 'M': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed; break;
		case 'N': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.51; break;
		case 'S': pNMEAData->ApparentWindSpeed = pNMEAData->awindspeed*0.45; break;
		default: break;
		}
	}

	// Wind direction and speed, with respect to north.
	if (pNMEADevice->bEnableWIMWD)
	{
		if (sscanf(ptr_WIMWD, "$WIMWD,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 8)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// Meteorological composite data.
	if (pNMEADevice->bEnableWIMDA)
	{
		if (sscanf(ptr_WIMDA, "$WIMDA,%lf,%c,%lf,%c,%lf,%c,,,,,,,%lf,%c,%lf,%c,%lf,%c,%lf,%c", 
			&f0, &c0, &pNMEAData->pressure, &pNMEAData->cpressure, &pNMEAData->temperature, &pNMEAData->ctemperature,  
			&pNMEAData->winddir, &pNMEAData->cwinddir, &f1, &c1, &f2, &c2, &pNMEAData->windspeed, &pNMEAData->cwindspeed) != 14)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Convert wind direction to angle in rad.
		pNMEAData->WindDir = pNMEAData->winddir*M_PI/180.0;

		pNMEAData->WindSpeed = pNMEAData->windspeed; 
	}

	// AIS data.
	if (pNMEADevice->bEnableAIVDM)
	{
		memset(aisbuf, 0, sizeof(aisbuf));
		if (sscanf(ptr_AIVDM, "!AIVDM,%d,%d,,%c,%127s", 
			&pNMEAData->nbsentences, &pNMEAData->sentence_number, &pNMEAData->AIS_channel, aisbuf) != 4)
		{
			//printf("Error reading data from a NMEADevice : Invalid data. \n");
			//return EXIT_FAILURE;
		}
		// Do other else if (sscanf() != x) if more/less complete sentence...

		// Only the most simple AIS messages are handled...
		if ((pNMEAData->nbsentences == 1)&&(pNMEAData->sentence_number == 1))
		{
			i = 0;
			// Search for the end of the AIS data payload.
			while ((i < (int)sizeof(aisbuf)-1)&&(aisbuf[i] != 0))
			{
				if (sscanf(aisbuf+i, ",%d", &pNMEAData->nbfillbits) == 1) 
				{
					aisbuflen = i;
					// Fill with 0 the rest of the buffer to keep only the AIS data payload in aisbuf.
					memset(aisbuf+i, 0, sizeof(aisbuf)-i);
					break;
				}
				i++;
			}
			if (aisbuflen != 0)
			{
				// Temporary...
#if defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
				decode_AIS(aisbuf, aisbuflen, &pNMEAData->AIS_Latitude, &pNMEAData->AIS_Longitude, &pNMEAData->AIS_SOG, &pNMEAData->AIS_COG);
#endif // defined(__cplusplus) && !defined(DISABLE_AIS_SUPPORT)
			}
			else
			{
				//printf("Error reading data from a NMEADevice : Invalid data. \n");
				//return EXIT_FAILURE;
			}
		}
		else
		{
			// Unhandled...
		}
	}

	pNMEADevice->LastNMEAData = *pNMEAData;

	return EXIT_SUCCESS;
}